

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O2

string * parse_host<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                   (string *__return_storage_ptr__,
                   request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                   *request)

{
  long lVar1;
  allocator<char> local_31;
  string_view local_30 [2];
  
  local_30[0] = boost::beast::http::basic_fields<std::allocator<char>_>::at
                          ((basic_fields<std::allocator<char>_> *)request,host);
  boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (__return_storage_ptr__,local_30,&local_31);
  lVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x151d8f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parse_host(const http::request<Body, http::basic_fields<Allocator>>& request) {
    std::string host = request.at(http::field::host).to_string();
    size_t pos = host.find(":");
    if (pos != std::string::npos) {
        host = host.substr(0, pos);
    }

    return host;
}